

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::environmentquestion(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  int iVar2;
  string currentWord;
  string local_48;
  
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  moveFromDataSpace(this,&local_48,src,(ulong)uVar1);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_48,"/COUNTED-STRING");
  uVar1 = 0xff;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_48,"/HOLD");
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_48,"ADDRESS-UNIT-BITS");
      if (iVar2 == 0) {
        uVar1 = 0x20;
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_48,"FLOORED");
        if (iVar2 == 0) {
          uVar1 = this->False;
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_48,"RETURN-STACK-CELLS");
          if (iVar2 == 0) {
            uVar1 = 100;
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_48,"STACK-CELLS");
            if (iVar2 == 0) {
LAB_001138b8:
              uVar1 = 200;
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_48,"CORE");
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_48,"EXCEPTION");
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_48,"FLOATING");
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_48,"WORDLISTS");
                    uVar1 = 0x100;
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_48,"#LOCALS");
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_48,"FLOATING-STACK");
                        if (iVar2 == 0) goto LAB_001138b8;
                        iVar2 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_48,"FLOATING");
                        uVar1 = 200;
                        if (iVar2 != 0) {
                          iVar2 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(&local_48,"MAX-FLOAT");
                          if (iVar2 != 0) {
                            ForthStack<unsigned_int>::setTop(this_00,this->False);
                            goto LAB_001138d3;
                          }
                          uVar1 = this->True;
                          ForthStack<double>::push(&this->fStack,1.79769313486232e+308);
                        }
                      }
                    }
                    goto LAB_001138bd;
                  }
                }
              }
              uVar1 = this->True;
            }
          }
        }
      }
    }
  }
LAB_001138bd:
  ForthStack<unsigned_int>::setTop(this_00,uVar1);
  ForthStack<unsigned_int>::push(this_00,this->True);
LAB_001138d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void environmentquestion(){
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop());
			std::string currentWord{};
			moveFromDataSpace(currentWord, caddr, length);
			Cell ret = False;
			if (currentWord.compare("/COUNTED-STRING") == 0){
				ret = 255;
			} else 
			if (currentWord.compare("/HOLD") == 0){
					ret = 255;
			}
				else
			if (currentWord.compare("ADDRESS-UNIT-BITS") == 0){
						ret = sizeof(Cell)*8;
					}
					else
						if (currentWord.compare("FLOORED") == 0){
							ret = False;
						}
						else
							if (currentWord.compare("RETURN-STACK-CELLS") == 0){
								ret = 100;
							}
							else
								if (currentWord.compare("STACK-CELLS") == 0){
									ret = 200;
								}
								else
									if (currentWord.compare("CORE") == 0){
										ret = True;
									}
									else
										if (currentWord.compare("EXCEPTION") == 0){
											ret = True;
										}
										else
											if (currentWord.compare("FLOATING") == 0){
												ret = True;
											} 
										else
											if (currentWord.compare("WORDLISTS") == 0){
												ret = 256;
											} 
										else
											if (currentWord.compare("#LOCALS") == 0){
												ret = 256;
											} 

#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
			else if (currentWord.compare("FLOATING-STACK") == 0){
				ret = 200;
			}else if (currentWord.compare("FLOATING") == 0){
				ret = 200;
			} else
			if (currentWord.compare("MAX-FLOAT") == 0){
				ret = True;
				fStack.push(std::numeric_limits<FCell>::max());
			}
#endif
			else {
				dStack.setTop(False);
				return;
			}